

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

StringRef llvm::sys::path::filename(StringRef path,Style style)

{
  reference pSVar1;
  Style in_R8D;
  StringRef Path;
  reverse_iterator local_60;
  Style local_2c;
  path *ppStack_28;
  Style style_local;
  StringRef path_local;
  
  path_local.Data = (char *)path.Length;
  ppStack_28 = (path *)path.Data;
  Path.Length._0_4_ = style;
  Path.Data = path_local.Data;
  Path.Length._4_4_ = 0;
  local_2c = style;
  rbegin(&local_60,ppStack_28,Path,in_R8D);
  pSVar1 = reverse_iterator::operator*(&local_60);
  return *pSVar1;
}

Assistant:

StringRef filename(StringRef path, Style style) { return *rbegin(path, style); }